

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall
CVmObjLookupTable::make_list
          (CVmObjLookupTable *this,vm_val_t *retval,int store_keys,
          _func_int_vm_val_t_ptr_vm_val_t_ptr *filter)

{
  uint *puVar1;
  CVmObjPageEntry *pCVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  uint uVar5;
  int iVar6;
  vm_val_t *pvVar7;
  bool bVar8;
  
  puVar1 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  uVar5 = puVar1[1];
  pvVar7 = (vm_val_t *)(puVar1 + (ulong)*puVar1 * 2 + 8);
  iVar6 = 0;
  while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
    if (pvVar7->typ != VM_EMPTY) {
      if (filter != (_func_int_vm_val_t_ptr_vm_val_t_ptr *)0x0) {
        iVar3 = (*filter)(pvVar7,pvVar7 + 1);
        if (iVar3 == 0) goto LAB_0025f6b4;
      }
      iVar6 = iVar6 + 1;
    }
LAB_0025f6b4:
    pvVar7 = (vm_val_t *)&pvVar7[2].val;
  }
  iVar3 = 0;
  vVar4 = CVmObjList::create(0,(long)iVar6);
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar4;
  pCVar2 = G_obj_table_X.pages_[vVar4 >> 0xc];
  CVmObjList::cons_clear((CVmObjList *)(pCVar2 + (vVar4 & 0xfff)));
  puVar1 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  uVar5 = puVar1[1];
  pvVar7 = (vm_val_t *)(puVar1 + (ulong)*puVar1 * 2 + 8);
  do {
    bVar8 = uVar5 == 0;
    uVar5 = uVar5 - 1;
    if (bVar8) {
      return;
    }
    if (pvVar7->typ != VM_EMPTY) {
      if (filter != (_func_int_vm_val_t_ptr_vm_val_t_ptr *)0x0) {
        iVar6 = (*filter)(pvVar7,pvVar7 + 1);
        if (iVar6 == 0) goto LAB_0025f74c;
      }
      CVmObjList::cons_set_element
                ((CVmObjList *)(pCVar2 + (vVar4 & 0xfff)),(long)iVar3,pvVar7 + (store_keys == 0));
      iVar3 = iVar3 + 1;
    }
LAB_0025f74c:
    pvVar7 = (vm_val_t *)&pvVar7[2].val;
  } while( true );
}

Assistant:

void CVmObjLookupTable::make_list(VMG_ vm_val_t *retval, int store_keys,
                                  int (*filter)(VMG_ const vm_val_t *,
                                                const vm_val_t *))
{
    vm_lookup_val *entry;
    uint i;
    int cnt;
    CVmObjList *lst;

    /* run through the table and count in-use entries */
    for (cnt = 0, i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; ++entry, --i)
    {
        /* skip empties */
        if (entry->key.typ == VM_EMPTY)
            continue;

        /* skip values that the filter function rejects */
        if (filter != 0 && !filter(vmg_ &entry->key, &entry->val))
            continue;

        /* count it */
        ++cnt;
    }

    /* allocate a list to store the results */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, cnt));

    /* get the list object */
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);
    lst->cons_clear();

    /* populate the list */
    for (cnt = 0, i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; ++entry, --i)
    {
        /* if the entry is not marked as free, count it as used */
        if (entry->key.typ != VM_EMPTY)
        {
            /* skip values that the filter function rejects */
            if (filter != 0 && !filter(vmg_ &entry->key, &entry->val))
                continue;

            /* store the key or value, as appropriate */
            if (store_keys)
            {
                /* store the key */
                lst->cons_set_element(cnt, &entry->key);
            }
            else
            {
                /* store the value */
                lst->cons_set_element(cnt, &entry->val);
            }

            /* update the destination index */
            ++cnt;
        }
    }
}